

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall
ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
          (basic_ifstream<char,_std::char_traits<char>_> *this,path *p,openmode mode)

{
  string local_40;
  
  std::ios::ios((ios *)&(this->super_basic_ifstream<char,_std::char_traits<char>_>).
                        super_basic_istream<char,_std::char_traits<char>_>.field_0x100);
  path::string_abi_cxx11_(&local_40,p);
  std::ifstream::ifstream
            ((ifstream *)this,(char *)&PTR_construction_vtable_24__001b4538,
             (_Ios_Openmode)local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_basic_ifstream<char,_std::char_traits<char>_>).
  super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream = (_func_int **)0x1b44f8;
  *(undefined8 *)
   &(this->super_basic_ifstream<char,_std::char_traits<char>_>).
    super_basic_istream<char,_std::char_traits<char>_>.field_0x100 = 0x1b4520;
  return;
}

Assistant:

explicit basic_ifstream(const path& p, std::ios_base::openmode mode = std::ios_base::in)
        : std::basic_ifstream<charT, traits>(p.string().c_str(), mode)
    {
    }